

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Itemset.cc
# Opt level: O2

ostream * operator<<(ostream *outputStream,Itemset *itemset)

{
  ostream *poVar1;
  
  std::operator<<(outputStream,"ITEM: ");
  operator<<(outputStream,
             (itemset->theItemset).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  poVar1 = std::operator<<(outputStream,"(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,itemset->theSupport);
  std::operator<<(poVar1,")");
  std::operator<<(outputStream,"\n");
  return outputStream;
}

Assistant:

ostream &operator<<(ostream &outputStream, Itemset &itemset) {
    outputStream << "ITEM: ";
    outputStream << *itemset.theItemset;
    outputStream << "(" << itemset.theSupport << ")";
    outputStream << "\n";
    return outputStream;
}